

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void __thiscall polyscope::Histogram::fillBuffers(Histogram *this)

{
  bool bVar1;
  element_type *peVar2;
  ulong uVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_10c;
  float local_108;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_104;
  double local_100;
  double local_f8;
  double local_f0;
  vector<double,_std::allocator<double>_> histCurveY;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coords;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> histCurveX;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  histCurveX.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  histCurveX.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  histCurveX.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = this->useSmoothed;
  if (bVar1 == true) {
    lVar6 = 0x80;
    pvVar4 = &this->unweightedSmoothedHistCurveY;
    if (this->useWeighted != false) {
      pvVar4 = &this->weightedSmoothedHistCurveY;
    }
    std::vector<double,_std::allocator<double>_>::operator=(&histCurveY,pvVar4);
  }
  else {
    lVar6 = 0x98;
    pvVar4 = &this->unweightedRawHistCurveY;
    if (this->useWeighted != false) {
      pvVar4 = &this->weightedRawHistCurveY;
    }
    std::vector<double,_std::allocator<double>_>::operator=(&histCurveY,pvVar4);
  }
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
            (&histCurveX,
             (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
             ((long)&(this->colormapRange).first + lVar6));
  coords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_50,"a_coord",(allocator *)&local_10c);
    (*peVar2->_vptr_ShaderProgram[0xf])(peVar2,local_50,&coords,0,0,0xffffffffffffffff);
    std::__cxx11::string::~string(local_50);
  }
  else {
    lVar6 = 8;
    for (uVar5 = 0;
        uVar3 = (long)histCurveX.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)histCurveX.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4, uVar5 < uVar3;
        uVar5 = uVar5 + 1) {
      local_f0 = histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
      local_100 = local_f0;
      if (bVar1 != false) {
        if (uVar5 != 0) {
          local_100 = (local_f0 +
                      histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5 - 1]) * 0.5;
        }
        if (uVar5 < uVar3 - 1) {
          local_f0 = (local_f0 +
                     histCurveY.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5 + 1]) * 0.5;
        }
      }
      local_f8 = *(double *)
                  ((long)(histCurveX.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar6);
      local_10c.x = (float)*(double *)
                            ((long)(histCurveX.
                                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                            lVar6 + -8);
      local_108 = 0.0;
      local_104.x = local_10c.x;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&coords,(vec<2,_float,_(glm::qualifier)0> *)&local_10c);
      local_10c.x = (float)local_f8;
      local_108 = 0.0;
      local_f8 = (double)CONCAT44(local_f8._4_4_,local_10c);
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&coords,(vec<2,_float,_(glm::qualifier)0> *)&local_10c);
      local_10c.x = local_104.x;
      local_108 = (float)local_100;
      local_100 = (double)CONCAT44(local_100._4_4_,local_108);
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&coords,(vec<2,_float,_(glm::qualifier)0> *)&local_10c);
      local_10c = local_f8._0_4_;
      local_108 = 0.0;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&coords,(vec<2,_float,_(glm::qualifier)0> *)&local_10c);
      local_10c = local_f8._0_4_;
      local_108 = (float)local_f0;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&coords,(vec<2,_float,_(glm::qualifier)0> *)&local_10c);
      local_10c = local_104;
      local_108 = (float)local_100._0_4_;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&coords,(vec<2,_float,_(glm::qualifier)0> *)&local_10c);
      lVar6 = lVar6 + 0x10;
    }
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_70,"a_coord",(allocator *)&local_10c);
    (*peVar2->_vptr_ShaderProgram[0xf])(peVar2,local_70,&coords,0,0,0xffffffffffffffff);
    std::__cxx11::string::~string(local_70);
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_90,"t_colormap",(allocator *)&local_10c);
    (*peVar2->_vptr_ShaderProgram[0x19])(peVar2,local_90,&this->colormap,1);
    std::__cxx11::string::~string(local_90);
    this->currBufferWeighted = this->useWeighted;
    this->currBufferSmoothed = this->useSmoothed;
  }
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&coords.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 );
  std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
  ~_Vector_base(&histCurveX.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               );
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&histCurveY.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void Histogram::fillBuffers() {

  // Fill from proper curve depending on current settings
  // (does unecessary copy as written)
  std::vector<double> histCurveY;
  std::vector<std::array<double, 2>> histCurveX;
  bool smoothBins = false; // draw trapezoids rather than rectangles
  if (useSmoothed) {
    if (useWeighted) {
      histCurveY = weightedSmoothedHistCurveY;
    } else {
      histCurveY = unweightedSmoothedHistCurveY;
    }
    histCurveX = smoothedHistCurveX;
    smoothBins = true;
  } else {
    if (useWeighted) {
      histCurveY = weightedRawHistCurveY;
    } else {
      histCurveY = unweightedRawHistCurveY;
    }
    histCurveX = rawHistCurveX;
  }

  // Push to buffer
  std::vector<glm::vec2> coords;

  if (histCurveY.size() == 0) {
    program->setAttribute("a_coord", coords);
    return;
  }

  // Extra first triangle
  for (size_t i = 0; i < histCurveX.size(); i++) {

    double leftX = histCurveX[i][0];
    double rightX = histCurveX[i][1];

    double leftY = histCurveY[i];
    double rightY = histCurveY[i];
    if (smoothBins) {
      if (i > 0) {
        leftY = 0.5 * (histCurveY[i - 1] + histCurveY[i]);
      }
      if (i < histCurveX.size() - 1) {
        rightY = 0.5 * (histCurveY[i] + histCurveY[i + 1]);
      }
    }

    // = Lower triangle (lower left, lower right, upper left)
    coords.push_back(glm::vec2{leftX, 0.0});
    coords.push_back(glm::vec2{rightX, 0.0});
    coords.push_back(glm::vec2{leftX, leftY});

    // = Upper triangle (lower right, upper right, upper left)
    coords.push_back(glm::vec2{rightX, 0.0});
    coords.push_back(glm::vec2{rightX, rightY});
    coords.push_back(glm::vec2{leftX, leftY});
  }

  program->setAttribute("a_coord", coords);
  program->setTextureFromColormap("t_colormap", colormap, true);

  // Update current buffer settings
  currBufferWeighted = useWeighted;
  currBufferSmoothed = useSmoothed;
}